

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1501.c
# Opt level: O1

int test(char *URL)

{
  __time_t _Var1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  timeval tVar10;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1e0;
  int local_1dc;
  timeval local_1d8;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1e0 = 0;
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  _Var1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(_Var1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                  ,0x2d,iVar2,uVar4);
  }
  if (iVar2 != 0) goto LAB_00102403;
  lVar5 = curl_easy_init();
  iVar2 = 0;
  if (lVar5 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                  ,0x2f);
    iVar2 = 0x7c;
  }
  lVar6 = 0;
  if (lVar5 != 0) {
    iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
    _Var1 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar4 = curl_easy_strerror(iVar3);
      curl_mfprintf(_Var1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                    ,0x31,iVar3,uVar4);
      iVar2 = iVar3;
    }
    if (iVar2 == 0) {
      iVar3 = curl_easy_setopt(lVar5,0x29,1);
      _Var1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar4 = curl_easy_strerror(iVar3);
        curl_mfprintf(_Var1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                      ,0x32,iVar3,uVar4);
        iVar2 = iVar3;
      }
      if (iVar2 == 0) {
        lVar6 = curl_multi_init();
        if (lVar6 == 0) {
          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                        ,0x34);
          iVar2 = 0x7b;
        }
        else {
          iVar2 = curl_multi_add_handle(lVar6,lVar5);
          _Var1 = _stderr;
          if (iVar2 == 0) {
            iVar2 = 0;
          }
          else {
            uVar4 = curl_multi_strerror(iVar2);
            curl_mfprintf(_Var1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                          ,0x36,iVar2,uVar4);
          }
          if (iVar2 == 0) {
            iVar2 = curl_multi_perform(lVar6,&local_1e0);
            _Var1 = _stderr;
            if (iVar2 == 0) {
              iVar2 = 0;
              if (local_1e0 < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                              ,0x38);
                iVar2 = 0x7a;
              }
            }
            else {
              uVar4 = curl_multi_strerror(iVar2);
              curl_mfprintf(_Var1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                            ,0x38,iVar2,uVar4);
            }
            if (iVar2 == 0) {
              tVar10 = tutil_tvnow();
              lVar7 = tutil_tvdiff(tVar10,tv_test_start);
              iVar2 = 0;
              if (lVar7 < 0x7531) {
                if (local_1e0 != 0) {
                  iVar2 = 0;
                  do {
                    local_1dc = -99;
                    local_1c8.tv_sec = 0;
                    local_1c8.tv_usec = 100000;
                    local_b8.__fds_bits[0] = 0;
                    local_b8.__fds_bits[1] = 0;
                    local_b8.__fds_bits[2] = 0;
                    local_b8.__fds_bits[3] = 0;
                    local_b8.__fds_bits[4] = 0;
                    local_b8.__fds_bits[5] = 0;
                    local_b8.__fds_bits[6] = 0;
                    local_b8.__fds_bits[7] = 0;
                    local_b8.__fds_bits[8] = 0;
                    local_b8.__fds_bits[9] = 0;
                    local_b8.__fds_bits[10] = 0;
                    local_b8.__fds_bits[0xb] = 0;
                    local_b8.__fds_bits[0xc] = 0;
                    local_b8.__fds_bits[0xd] = 0;
                    local_b8.__fds_bits[0xe] = 0;
                    local_b8.__fds_bits[0xf] = 0;
                    local_138.__fds_bits[0] = 0;
                    local_138.__fds_bits[1] = 0;
                    local_138.__fds_bits[2] = 0;
                    local_138.__fds_bits[3] = 0;
                    local_138.__fds_bits[4] = 0;
                    local_138.__fds_bits[5] = 0;
                    local_138.__fds_bits[6] = 0;
                    local_138.__fds_bits[7] = 0;
                    local_138.__fds_bits[8] = 0;
                    local_138.__fds_bits[9] = 0;
                    local_138.__fds_bits[10] = 0;
                    local_138.__fds_bits[0xb] = 0;
                    local_138.__fds_bits[0xc] = 0;
                    local_138.__fds_bits[0xd] = 0;
                    local_138.__fds_bits[0xe] = 0;
                    local_138.__fds_bits[0xf] = 0;
                    local_1b8.__fds_bits[0xe] = 0;
                    local_1b8.__fds_bits[0xf] = 0;
                    local_1b8.__fds_bits[0xc] = 0;
                    local_1b8.__fds_bits[0xd] = 0;
                    local_1b8.__fds_bits[10] = 0;
                    local_1b8.__fds_bits[0xb] = 0;
                    local_1b8.__fds_bits[8] = 0;
                    local_1b8.__fds_bits[9] = 0;
                    local_1b8.__fds_bits[6] = 0;
                    local_1b8.__fds_bits[7] = 0;
                    local_1b8.__fds_bits[4] = 0;
                    local_1b8.__fds_bits[5] = 0;
                    local_1b8.__fds_bits[2] = 0;
                    local_1b8.__fds_bits[3] = 0;
                    local_1b8.__fds_bits[0] = 0;
                    local_1b8.__fds_bits[1] = 0;
                    iVar3 = curl_multi_fdset(lVar6,&local_b8,&local_138,&local_1b8,&local_1dc);
                    _Var1 = _stderr;
                    if (iVar3 == 0) {
                      if (local_1dc < -1) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                                      ,0x4d);
                        iVar2 = 0x7a;
                      }
                    }
                    else {
                      uVar4 = curl_multi_strerror(iVar3);
                      curl_mfprintf(_Var1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                                    ,0x4d,iVar3,uVar4);
                      iVar2 = iVar3;
                    }
                    iVar3 = 0xc;
                    if (iVar2 == 0) {
                      iVar2 = select_wrapper(local_1dc + 1,&local_b8,&local_138,&local_1b8,
                                             &local_1c8);
                      if (iVar2 == -1) {
                        piVar8 = __errno_location();
                        iVar2 = *piVar8;
                        local_1d8.tv_sec = _stderr;
                        pcVar9 = strerror(iVar2);
                        curl_mfprintf(local_1d8.tv_sec,"%s:%d select() failed, with errno %d (%s)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                                      ,0x51,iVar2,pcVar9);
                        iVar2 = 0x79;
                      }
                      else {
                        tVar10 = tutil_tvnow();
                        lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                        if (lVar7 < 0x7531) {
                          curl_mfprintf(_stderr,"ping\n");
                          local_1d8 = tutil_tvnow();
                          iVar2 = curl_multi_perform(lVar6,&local_1e0);
                          _Var1 = _stderr;
                          if (iVar2 == 0) {
                            iVar2 = 0;
                            if (local_1e0 < 0) {
                              curl_mfprintf(_stderr,
                                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                                            ,0x58);
                              iVar2 = 0x7a;
                            }
                          }
                          else {
                            uVar4 = curl_multi_strerror(iVar2);
                            curl_mfprintf(_Var1,
                                          "%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                                          ,0x58,iVar2,uVar4);
                          }
                          if (iVar2 == 0) {
                            tVar10 = tutil_tvnow();
                            lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                            if (lVar7 < 0x7531) {
                              tVar10 = tutil_tvnow();
                              lVar7 = tutil_tvdiff(tVar10,local_1d8);
                              curl_mfprintf(_stderr,"pong = %ld\n",lVar7);
                              iVar3 = 0;
                              if (500 < lVar7) {
                                iVar3 = 0x26;
                              }
                              iVar2 = 0;
                              if (500 < lVar7) {
                                iVar2 = 100;
                              }
                            }
                            else {
                              curl_mfprintf(_stderr,
                                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                                            ,0x5a);
                              iVar2 = 0x7d;
                            }
                          }
                        }
                        else {
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                                        ,0x53);
                          iVar2 = 0x7d;
                        }
                      }
                    }
                    if (iVar3 != 0) {
                      if ((iVar3 != 0x26) && (iVar3 != 0xc)) goto LAB_00102403;
                      break;
                    }
                  } while (local_1e0 != 0);
                }
              }
              else {
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1501.c"
                              ,0x3a);
                iVar2 = 0x7d;
              }
            }
          }
        }
        goto LAB_001023ee;
      }
    }
    lVar6 = 0;
  }
LAB_001023ee:
  curl_multi_cleanup(lVar6);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
LAB_00102403:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURLM *mhandle = NULL;
  int res = 0;
  int still_running = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(handle);

  easy_setopt(handle, CURLOPT_URL, URL);
  easy_setopt(handle, CURLOPT_VERBOSE, 1L);

  multi_init(mhandle);

  multi_add_handle(mhandle, handle);

  multi_perform(mhandle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;
    struct timeval before;
    struct timeval after;
    long e;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(mhandle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    fprintf(stderr, "ping\n");
    before = tutil_tvnow();

    multi_perform(mhandle, &still_running);

    abort_on_test_timeout();

    after = tutil_tvnow();
    e = tutil_tvdiff(after, before);
    fprintf(stderr, "pong = %ld\n", e);

    if(e > MAX_BLOCKED_TIME_MS) {
      res = 100;
      break;
    }
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(mhandle);
  curl_easy_cleanup(handle);
  curl_global_cleanup();

  return res;
}